

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O1

void test_normal(cache *Cache)

{
  int iVar1;
  int in_ECX;
  record *prVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  record *record;
  record *prVar6;
  
  prVar6 = Cache->records;
  uVar5 = Cache->length;
  if ((uVar5 == 0) || (prVar6->next == -1)) {
    uVar3 = 0;
    prVar2 = prVar6;
  }
  else {
    uVar4 = 0;
    iVar1 = prVar6->next;
    do {
      in_ECX = iVar1;
      uVar3 = uVar5;
      if (uVar5 - 1 == uVar4) break;
      iVar1 = prVar6[in_ECX].next;
      uVar3 = uVar4 + 1;
      uVar4 = uVar3;
    } while (iVar1 != -1);
    uVar3 = uVar3 & 0xffffffff;
    prVar2 = prVar6 + in_ECX;
  }
  if ((uVar5 == uVar3) && (prVar2->next < 1)) {
    if (uVar5 == 0) {
      uVar3 = 0;
    }
    else {
      uVar4 = 0;
      do {
        uVar3 = uVar4;
        if ((long)prVar2->last < 0) break;
        prVar2 = prVar6 + prVar2->last;
        uVar4 = uVar4 + 1;
        uVar3 = uVar5;
      } while (uVar5 != uVar4);
      uVar3 = uVar3 & 0xffffffff;
    }
    if ((uVar5 == uVar3) &&
       ((uVar5 < 2 || ((Cache->first == prVar6->next && (Cache->last == in_ECX)))))) {
      return;
    }
  }
  else if (Cache->length != 0) {
    uVar5 = 0;
    do {
      if ((long)prVar6->next == -1) break;
      prVar6 = Cache->records + prVar6->next;
      printf("%d-",(ulong)(uint)prVar6->next);
      uVar5 = uVar5 + 1;
    } while (uVar5 < Cache->length);
  }
  exit(1);
}

Assistant:

void test_normal(cache* Cache) {
  struct record *record = &Cache->records[LRU_BUFFER_HEAD_POINT];
  int count = 0, last;
  for (int i = 0; i < Cache->length && record->next != -1; i++, count++) {
    last = record->next;
    record = &Cache->records[record->next];
  }
  if (count != Cache->length || record->next > 0) {
    #ifdef LOG_INCLUDED
    log_error("error1: length:%d,count=%d, record->next:%d,last.next:%d\n",
           (int)Cache->length, count, record->next, Cache->records[last].next);
    #endif
    struct record *record = &Cache->records[LRU_BUFFER_HEAD_POINT];
    int count = 0, last;
    for (int i = 0; i < Cache->length && record->next != -1; i++) {
      last = record->next;
      record = &Cache->records[record->next];
      printf("%d-", record->next);
    }
    exit(EXIT_FAILURE);
  }
  count = 0;
  for (int i = 0; i < Cache->length && record->last >= 0; i++, count++) {
    record = &Cache->records[record->last];
  }

  if (count != Cache->length) {
    #ifdef LOG_INCLUDED
    log_error("error2:%d\n", count);
    #endif
    exit(EXIT_FAILURE);
  }
  int first = Cache->records[LRU_BUFFER_HEAD_POINT].next;
  if (Cache->length > 1 && (Cache->first != first || Cache->last != last)) {
    #ifdef LOG_INCLUDED
    log_error("error3");
    #endif
    exit(EXIT_FAILURE);
  }
  #ifdef LOG_INCLUDED
  log_debug("check good\n");
  #endif
}